

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

bool __thiscall minihttp::TcpSocket::SendBytes(TcpSocket *this,void *str,uint len)

{
  ssize_t sVar1;
  char cVar2;
  bool bVar3;
  void *__buf;
  uint uVar4;
  ulong uVar5;
  
  bVar3 = true;
  if (len != 0) {
    uVar5 = 0;
    if (this->_s != -1) {
      do {
        __buf = (void *)(uVar5 + (long)str);
        sVar1 = send((int)this->_s,__buf,(ulong)(len - (int)uVar5),0x4000);
        uVar4 = (uint)sVar1;
        if ((int)uVar4 < 1) {
          cVar2 = '\0';
          if ((int)uVar4 < 0) {
            close(this,(int)__buf);
            cVar2 = '\x01';
          }
        }
        else {
          if (len < uVar4) {
            __assert_fail("(unsigned)ret <= len",
                          "/workspace/llm4binary/github/license_c_cmakelists/fgenesis[P]minihttp/minihttp.cpp"
                          ,0x291,"bool minihttp::TcpSocket::SendBytes(const void *, unsigned int)");
          }
          uVar4 = (int)uVar5 + uVar4;
          uVar5 = (ulong)uVar4;
          cVar2 = (len <= uVar4) * '\x03';
        }
      } while (cVar2 == '\0');
      if (cVar2 == '\x03') {
        if ((uint)uVar5 == len) {
          return true;
        }
        __assert_fail("written == len",
                      "/workspace/llm4binary/github/license_c_cmakelists/fgenesis[P]minihttp/minihttp.cpp"
                      ,0x2a0,"bool minihttp::TcpSocket::SendBytes(const void *, unsigned int)");
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool TcpSocket::SendBytes(const void *str, unsigned int len)
{
    if(!len)
        return true;
    if(!SOCKETVALID(_s))
        return false;
    //traceprint("SEND: '%s'\n", str);

    unsigned written = 0;
    while(true) // FIXME: buffer bytes to an internal queue instead?
    {
        int ret = _writeBytes((const unsigned char*)str + written, len - written);
        if(ret > 0)
        {
            assert((unsigned)ret <= len);
            written += (unsigned)ret;
            if(written >= len)
                break;
        }
        else if(ret < 0)
        {
            int err = ret == -1 ? _GetError() : ret;
            traceprint("SendBytes: error %d: %s\n", err, _GetErrorStr(err).c_str());
            close();
            return false;
        }
        // and if ret == 0, keep trying.
    }

    assert(written == len);
    return true;
}